

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_render.cpp
# Opt level: O3

Node * __thiscall OpacityTextures::build(OpacityTextures *this)

{
  Node *this_00;
  Node *pNVar1;
  Node *pNVar2;
  TransformNode *this_01;
  TransformNode *pTVar3;
  Node *pNVar4;
  rect2d rect;
  vec4 color;
  rect2d rect_00;
  vec4 color_00;
  vec4 color_01;
  rect2d rect_01;
  vec4 color_02;
  rect2d rect_02;
  
  this_00 = rengine::Node::create();
  pNVar1 = &rengine::OpacityNode::create()->super_Node;
  *(undefined4 *)&pNVar1->field_0x34 = 0x3f000000;
  pNVar2 = (Node *)rengine::RectangleNode::create();
  rect.br.x = 20.0;
  rect.br.y = 20.0;
  rect.tl.x = 10.0;
  rect.tl.y = 10.0;
  rengine::RectangleNodeBase::setGeometry((RectangleNodeBase *)pNVar2,rect);
  color.z = 0.0;
  color.w = 1.0;
  color.x = 1.0;
  color.y = 0.0;
  rengine::RectangleNode::setColor((RectangleNode *)pNVar2,color);
  rengine::Node::append(pNVar1,pNVar2);
  pNVar2 = (Node *)rengine::RectangleNode::create();
  rect_00.br.x = 21.0;
  rect_00.br.y = 21.0;
  rect_00.tl.x = 11.0;
  rect_00.tl.y = 11.0;
  rengine::RectangleNodeBase::setGeometry((RectangleNodeBase *)pNVar2,rect_00);
  rengine::RectangleNode::setColor
            ((RectangleNode *)pNVar2,(vec4)(ZEXT816(0x3f8000003f800000) << 0x40));
  rengine::Node::append(pNVar1,pNVar2);
  rengine::Node::append(this_00,pNVar1);
  this_01 = rengine::TransformNode::create();
  *(undefined8 *)&(this_01->super_Node).field_0x34 = 0x3f800000;
  *(undefined8 *)&this_01->field_0x3c = 0x41f0000000000000;
  *(undefined8 *)&this_01->field_0x44 = 0x3f80000000000000;
  *(undefined8 *)&this_01->field_0x4c = 0x4120000000000000;
  *(undefined8 *)&this_01->field_0x54 = 0;
  *(undefined4 *)&this_01->field_0x5c = 0x3f800000;
  *(undefined8 *)&this_01->field_0x60 = 0;
  *(undefined8 *)&this_01->field_0x68 = 0;
  *(undefined8 *)&this_01->field_0x70 = 0x13f800000;
  this_01->m_projectionDepth = 0.0;
  pNVar1 = &rengine::OpacityNode::create()->super_Node;
  *(undefined4 *)&pNVar1->field_0x34 = 0x3f000000;
  pTVar3 = rengine::TransformNode::create();
  *(undefined8 *)&(pTVar3->super_Node).field_0x34 = 0x3f800000;
  *(undefined8 *)&pTVar3->field_0x3c = 0x3f80000000000000;
  *(undefined8 *)&pTVar3->field_0x44 = 0x3f80000000000000;
  *(undefined8 *)&pTVar3->field_0x4c = 0x3f80000000000000;
  *(undefined8 *)&pTVar3->field_0x54 = 0;
  *(undefined4 *)&pTVar3->field_0x5c = 0x3f800000;
  *(undefined8 *)&pTVar3->field_0x60 = 0;
  *(undefined8 *)&pTVar3->field_0x68 = 0;
  *(undefined8 *)&pTVar3->field_0x70 = 0x13f800000;
  pTVar3->m_projectionDepth = 0.0;
  pNVar2 = (Node *)rengine::RectangleNode::create();
  rengine::RectangleNodeBase::setGeometry
            ((RectangleNodeBase *)pNVar2,(rect2d)(ZEXT816(0x4120000041200000) << 0x40));
  color_00.z = 0.0;
  color_00.w = 1.0;
  color_00.x = 0.0;
  color_00.y = 1.0;
  rengine::RectangleNode::setColor((RectangleNode *)pNVar2,color_00);
  rengine::Node::append(&pTVar3->super_Node,pNVar2);
  rengine::Node::append(pNVar1,&pTVar3->super_Node);
  pTVar3 = rengine::TransformNode::create();
  *(undefined8 *)&(pTVar3->super_Node).field_0x34 = 0x3f800000;
  *(undefined8 *)&pTVar3->field_0x3c = 0x4000000000000000;
  *(undefined8 *)&pTVar3->field_0x44 = 0x3f80000000000000;
  *(undefined8 *)&pTVar3->field_0x4c = 0x4000000000000000;
  *(undefined8 *)&pTVar3->field_0x54 = 0;
  *(undefined4 *)&pTVar3->field_0x5c = 0x3f800000;
  *(undefined8 *)&pTVar3->field_0x60 = 0;
  *(undefined8 *)&pTVar3->field_0x68 = 0;
  *(undefined8 *)&pTVar3->field_0x70 = 0x13f800000;
  pTVar3->m_projectionDepth = 0.0;
  pNVar2 = (Node *)rengine::RectangleNode::create();
  rengine::RectangleNodeBase::setGeometry
            ((RectangleNodeBase *)pNVar2,(rect2d)(ZEXT816(0x4120000041200000) << 0x40));
  color_01.z = 0.0;
  color_01.w = 1.0;
  color_01.x = 1.0;
  color_01.y = 0.0;
  rengine::RectangleNode::setColor((RectangleNode *)pNVar2,color_01);
  rengine::Node::append(&pTVar3->super_Node,pNVar2);
  rengine::Node::append(pNVar1,&pTVar3->super_Node);
  rengine::Node::append(&this_01->super_Node,pNVar1);
  rengine::Node::append(this_00,&this_01->super_Node);
  pNVar1 = &rengine::OpacityNode::create()->super_Node;
  *(undefined4 *)&pNVar1->field_0x34 = 0x3f4ccccd;
  pNVar2 = &rengine::OpacityNode::create()->super_Node;
  *(undefined4 *)&pNVar2->field_0x34 = 0x3f4ccccd;
  pNVar4 = (Node *)rengine::RectangleNode::create();
  rect_01.br.x = 110.0;
  rect_01.br.y = 20.0;
  rect_01.tl.x = 100.0;
  rect_01.tl.y = 10.0;
  rengine::RectangleNodeBase::setGeometry((RectangleNodeBase *)pNVar4,rect_01);
  color_02.z = 0.0;
  color_02.w = 1.0;
  color_02.x = 1.0;
  color_02.y = 0.0;
  rengine::RectangleNode::setColor((RectangleNode *)pNVar4,color_02);
  rengine::Node::append(pNVar2,pNVar4);
  pNVar4 = (Node *)rengine::RectangleNode::create();
  rect_02.br.x = 111.0;
  rect_02.br.y = 21.0;
  rect_02.tl.x = 101.0;
  rect_02.tl.y = 11.0;
  rengine::RectangleNodeBase::setGeometry((RectangleNodeBase *)pNVar4,rect_02);
  rengine::RectangleNode::setColor
            ((RectangleNode *)pNVar4,(vec4)(ZEXT816(0x3f8000003f800000) << 0x40));
  rengine::Node::append(pNVar2,pNVar4);
  rengine::Node::append(pNVar1,pNVar2);
  rengine::Node::append(this_00,pNVar1);
  return this_00;
}

Assistant:

Node *build() override {
        Node *root = Node::create();

        *root

            // Two rectangles stacked on top of each other, no opacity bleed-through
            << &(*OpacityNode::create(0.5)
                 << RectangleNode::create(rect2d::fromXywh(10, 10, 10, 10), vec4(1, 0, 0, 1))
                 << RectangleNode::create(rect2d::fromXywh(11, 11, 10, 10), vec4(0, 0, 1, 1))
                )

            // Two rectangles stacked on top of each other, positioned with a transform node, no opacity bleed-through
            << &(*TransformNode::create(mat4::translate2D(30, 10))
                 << &(*OpacityNode::create(0.5)
                      << &(*TransformNode::create(mat4::translate2D(1, 1))
                           << RectangleNode::create(rect2d::fromXywh(0, 0, 10, 10), vec4(0, 1, 0, 1))
                          )
                      << &(*TransformNode::create(mat4::translate2D(2, 2))
                           << RectangleNode::create(rect2d::fromXywh(0, 0, 10, 10), vec4(1, 0, 0, 1))
                          )
                     )
                )

            // Nested layers
            << &(*OpacityNode::create(0.8)
                 << &(*OpacityNode::create(0.8)
                      << RectangleNode::create(rect2d::fromXywh(100, 10, 10, 10), vec4(1, 0, 0, 1))
                      << RectangleNode::create(rect2d::fromXywh(101, 11, 10, 10), vec4(0, 0, 1, 1))
                     )
                )

            ;

        return root;
    }